

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessQueriesTests.cpp
# Opt level: O0

bool __thiscall gl4cts::DirectStateAccess::Queries::FunctionalTest::checkView(FunctionalTest *this)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar3;
  uint local_1c4;
  uint local_1c0;
  uint local_1bc;
  uint local_1b8 [4];
  MessageBuilder local_1a8;
  byte local_24;
  byte local_23;
  byte local_22;
  byte local_21;
  long lStack_20;
  GLubyte pixel [4];
  Functions *gl;
  FunctionalTest *this_local;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar1);
  memset(&local_24,0,4);
  (**(code **)(lStack_20 + 0x1220))(0,0,1,1,0x1908,0x1401,&local_24);
  err = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(err,"glReadPixels have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                  ,0x7b3);
  if ((((local_24 == 0xff) && (local_23 == 0)) && (local_22 == 0)) && (local_21 == 0xff)) {
    this_local._7_1_ = true;
  }
  else {
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1a8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_1a8,(char (*) [21])"Frameuffer content (");
    local_1b8[0] = (uint)local_24;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1b8);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a3caab);
    local_1bc = (uint)local_23;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1bc);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a3caab);
    local_1c0 = (uint)local_22;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1c0);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a3caab);
    local_1c4 = (uint)local_21;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1c4);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [47])") is different than expected (255, 0, 0, 255).");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a8);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FunctionalTest::checkView()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Fetch framebuffer data. */
	glw::GLubyte pixel[4] = { 0 };

	gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, pixel);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels have failed");

	/* Comparison with expected values. */
	if ((255 != pixel[0]) || (0 != pixel[1]) || (0 != pixel[2]) || (255 != pixel[3]))
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Frameuffer content (" << (unsigned int)pixel[0] << ", "
			<< (unsigned int)pixel[1] << ", " << (unsigned int)pixel[2] << ", " << (unsigned int)pixel[3]
			<< ") is different than expected (255, 0, 0, 255)." << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}